

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall Instance::printTrainRoute(Instance *this)

{
  bool bVar1;
  ast_vector_tpl<z3::expr> *this_00;
  reference ppEVar2;
  reference this_01;
  reference pvVar3;
  ostream *poVar4;
  long in_RDI;
  Edge *edge;
  iterator __end3;
  iterator __begin3;
  vector<Edge_*,_std::allocator<Edge_*>_> *__range3;
  size_t time;
  bool reachedGoal;
  Train train;
  iterator __end1;
  iterator __begin1;
  vector<Train,_std::allocator<Train>_> *__range1;
  model m;
  ostream *in_stack_fffffffffffffee8;
  Train *in_stack_fffffffffffffef0;
  Train *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  Z3_lbool in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff3f;
  expr *in_stack_ffffffffffffff40;
  Edge *this_02;
  Edge *pEVar5;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_a8;
  long local_a0;
  ulong local_98;
  byte local_8d;
  uint local_80;
  uint local_70;
  Train *local_30;
  __normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_> local_28;
  long local_20;
  
  z3::optimize::get_model((optimize *)in_stack_ffffffffffffff08);
  local_20 = in_RDI + 0x120;
  local_28._M_current =
       (Train *)std::vector<Train,_std::allocator<Train>_>::begin
                          ((vector<Train,_std::allocator<Train>_> *)in_stack_fffffffffffffee8);
  local_30 = (Train *)std::vector<Train,_std::allocator<Train>_>::end
                                ((vector<Train,_std::allocator<Train>_> *)in_stack_fffffffffffffee8)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_> *)
                       in_stack_fffffffffffffef0,
                       (__normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_> *)
                       in_stack_fffffffffffffee8);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_>::operator*
              (&local_28);
    Train::Train((Train *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08);
    local_8d = 0;
    for (local_98 = 0; local_98 < *(uint *)(in_RDI + 0x138); local_98 = local_98 + 1) {
      this_00 = (ast_vector_tpl<z3::expr> *)std::ostream::operator<<((ostream *)&std::cout,local_98)
      ;
      std::operator<<((ostream *)this_00,": ");
      if ((local_98 < local_70) || ((local_8d & 1) != 0)) {
        std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      }
      else {
        local_a0 = in_RDI + 0x108;
        local_a8._M_current =
             (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin
                                ((vector<Edge_*,_std::allocator<Edge_*>_> *)
                                 in_stack_fffffffffffffee8);
        std::vector<Edge_*,_std::allocator<Edge_*>_>::end
                  ((vector<Edge_*,_std::allocator<Edge_*>_> *)in_stack_fffffffffffffee8);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                              *)in_stack_fffffffffffffef0,
                             (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                              *)in_stack_fffffffffffffee8);
          if (!bVar1) break;
          ppEVar2 = __gnu_cxx::
                    __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                    operator*(&local_a8);
          this_02 = *ppEVar2;
          this_01 = std::
                    vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                    ::operator[]((vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                  *)(in_RDI + 0x158),(ulong)local_80);
          std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
          ::operator[](this_01,local_98);
          z3::ast_vector_tpl<z3::expr>::operator[](this_00,in_stack_ffffffffffffff14);
          z3::model::eval((model *)this_02,in_stack_ffffffffffffff40,(bool)in_stack_ffffffffffffff3f
                         );
          in_stack_ffffffffffffff14 = z3::expr::bool_value((expr *)in_stack_fffffffffffffef0);
          z3::expr::~expr((expr *)0x107943);
          z3::expr::~expr((expr *)0x10794d);
          if (in_stack_ffffffffffffff14 == Z3_L_TRUE) {
            pEVar5 = this_02;
            pvVar3 = std::vector<Stop,_std::allocator<Stop>_>::back
                               ((vector<Stop,_std::allocator<Stop>_> *)in_stack_fffffffffffffef0);
            local_8d = this_02 == pvVar3->stopEdge;
            in_stack_ffffffffffffff08 = (Train *)std::operator<<((ostream *)&std::cout,"(");
            poVar4 = (ostream *)
                     std::ostream::operator<<((ostream *)in_stack_ffffffffffffff08,pEVar5->to);
            in_stack_fffffffffffffef0 = (Train *)std::operator<<(poVar4," ");
            in_stack_fffffffffffffee8 =
                 (ostream *)
                 std::ostream::operator<<((ostream *)in_stack_fffffffffffffef0,pEVar5->from);
            std::operator<<(in_stack_fffffffffffffee8,") ");
          }
          __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
          operator++(&local_a8);
        }
        std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      }
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    Train::~Train(in_stack_fffffffffffffef0);
    __gnu_cxx::__normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_>::operator++
              (&local_28);
  }
  z3::model::~model((model *)in_stack_fffffffffffffef0);
  return;
}

Assistant:

void Instance::printTrainRoute() {
  model m = solver.get_model();
  for (Train train : trains) {
    bool reachedGoal = false;
    for (size_t time = 0; time < maxTimeSteps; time++) {
      std::cout << time << ": "; 
      if(time < train.start.arrivalTime || reachedGoal){
        std::cout << std::endl;
        continue;
      }
      for (Edge *edge : graph.edges) {
        if (m.eval(occupiedVars[train.id][time][edge->id], false)
                .bool_value() == Z3_TRUE) {
          reachedGoal = edge == train.stops.back().stopEdge;
          std::cout << "(" << edge->to << " " << edge->from << ") ";
        }
      }
      std::cout << std::endl;
    }
    std::cout << std::endl;
  }
}